

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void Eigen::internal::general_matrix_matrix_product<long,_float,_1,_false,_float,_0,_false,_0,_1>::
     run(long rows,long cols,long depth,float *_lhs,long lhsStride,float *_rhs,long rhsStride,
        ResScalar *_res,long resIncr,long resStride,ResScalar alpha,
        level3_blocking<float,_float> *blocking,GemmParallelInfo<long> *info)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined8 uVar4;
  undefined8 blockA_00;
  long *plVar5;
  ulong size;
  ulong size_00;
  LhsScalar *pLVar6;
  RhsScalar *pRVar7;
  undefined1 *puVar8;
  long lVar9;
  undefined1 auStack_3f8 [8];
  float *local_3f0;
  float *local_3e8;
  float *local_3e0;
  float *local_3d8;
  bool local_3d0;
  undefined7 uStack_3cf;
  long local_3c8;
  long local_3c0;
  bool local_3b8;
  undefined7 uStack_3b7;
  bool local_3a9;
  float *local_3a8;
  RhsScalar *local_3a0;
  RhsScalar *local_398;
  RhsScalar *local_390;
  float *local_388;
  LhsScalar *local_380;
  LhsScalar *local_378;
  blas_data_mapper<float,_long,_0,_0,_1> local_370;
  const_blas_data_mapper<float,_long,_0> local_360;
  long local_350;
  long local_348;
  long actual_nc;
  long j2;
  long local_330;
  long local_328;
  long local_320;
  long actual_kc;
  long k2;
  long local_308;
  long actual_mc;
  long i2;
  undefined1 local_2f0 [7];
  bool pack_rhs_once;
  aligned_stack_memory_handler<float> blockB_stack_memory_destructor;
  float *blockB;
  undefined1 local_2c0 [8];
  aligned_stack_memory_handler<float> blockA_stack_memory_destructor;
  float *blockA;
  size_t sizeB;
  size_t sizeA;
  gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
  gebp;
  gemm_pack_rhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_4,_0,_false,_false>
  pack_rhs;
  Index IStack_288;
  gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_1,_false,_false>
  pack_lhs;
  long nc;
  long local_270;
  long mc;
  long kc;
  ResMapper res;
  RhsMapper rhs;
  LhsMapper lhs;
  ResScalar alpha_local;
  float *_rhs_local;
  long lhsStride_local;
  float *_lhs_local;
  long depth_local;
  long cols_local;
  long rows_local;
  ulong local_1f0;
  long local_1e8;
  float *local_1e0;
  long *local_1d8;
  long local_1d0;
  float *local_1c8;
  long *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  float *local_1a8;
  long *local_1a0;
  undefined8 local_198;
  long local_190;
  float *local_188;
  long *local_180;
  long local_178;
  long local_170;
  ResScalar *local_168;
  long *local_160;
  long local_158;
  long local_150;
  long *local_148;
  undefined1 local_140 [16];
  float *local_130;
  float *local_128;
  undefined1 *local_120;
  long local_118;
  long local_110;
  long *local_108;
  undefined8 local_100;
  float *local_f8;
  float *local_f0;
  undefined1 *local_e8;
  long local_e0;
  long local_d8;
  long *local_d0;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  float *local_b0;
  float *local_a8;
  undefined1 *local_a0;
  long local_98;
  long local_90;
  long *local_88;
  undefined1 local_80 [16];
  long local_70;
  long local_68;
  undefined1 *local_60;
  long local_58;
  long local_50;
  long *local_48;
  undefined8 local_40;
  long local_38;
  long local_30;
  undefined1 *local_28;
  long local_20;
  long local_18;
  long *local_10;
  
  puVar8 = auStack_3f8;
  local_1c0 = &rhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride;
  local_198 = 1;
  local_1d8 = &res.m_stride;
  local_1e8 = rhsStride;
  local_1b0 = rhsStride;
  local_1b8 = 1;
  rhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data = (float *)rhsStride;
  local_160 = &kc;
  local_168 = _res;
  local_170 = resStride;
  local_178 = resIncr;
  kc = (long)_res;
  res.m_data = (float *)resStride;
  _lhs_local = (float *)depth;
  depth_local = cols;
  cols_local = rows;
  local_1e0 = _rhs;
  local_1d0 = lhsStride;
  local_1c8 = _lhs;
  local_1a8 = _rhs;
  local_1a0 = local_1d8;
  local_190 = lhsStride;
  local_188 = _lhs;
  local_180 = local_1c0;
  res.m_stride = (long)_rhs;
  rhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = (long)_lhs;
  if (resIncr == 1) {
    mc = level3_blocking<float,_float>::kc(blocking);
    nc = level3_blocking<float,_float>::mc(blocking);
    plVar5 = std::min<long>(&cols_local,&nc);
    local_270 = *plVar5;
    IStack_288 = level3_blocking<float,_float>::nc(blocking);
    plVar5 = std::min<long>(&depth_local,&stack0xfffffffffffffd78);
    lVar1 = *plVar5;
    ignore_unused_variable<Eigen::internal::GemmParallelInfo<long>*>(&info);
    size = mc * local_270;
    size_00 = mc * lVar1;
    local_1f0 = size;
    if (0x3fffffffffffffff < size) {
      throw_std_bad_alloc();
    }
    pLVar6 = level3_blocking<float,_float>::blockA(blocking);
    if (pLVar6 == (LhsScalar *)0x0) {
      if (size * 4 < 0x20001) {
        lVar2 = -(size * 4 + 0x1e & 0xfffffffffffffff0);
        puVar8 = auStack_3f8 + lVar2;
        local_380 = (LhsScalar *)((long)&local_3f0 + lVar2);
      }
      else {
        local_380 = (LhsScalar *)aligned_malloc(size * 4);
      }
      local_378 = local_380;
    }
    else {
      local_378 = level3_blocking<float,_float>::blockA(blocking);
      puVar8 = auStack_3f8;
    }
    blockA_stack_memory_destructor._16_8_ = local_378;
    *(undefined8 *)(puVar8 + -8) = 0x243fb4;
    pLVar6 = level3_blocking<float,_float>::blockA(blocking);
    if (pLVar6 == (LhsScalar *)0x0) {
      local_388 = (float *)blockA_stack_memory_destructor._16_8_;
    }
    else {
      local_388 = (float *)0x0;
    }
    pfVar3 = local_388;
    *(undefined8 *)(puVar8 + -8) = 0x244009;
    aligned_stack_memory_handler<float>::aligned_stack_memory_handler
              ((aligned_stack_memory_handler<float> *)local_2c0,pfVar3,size,0x20000 < size * 4);
    rows_local = size_00;
    if (0x3fffffffffffffff < size_00) {
      *(undefined8 *)(puVar8 + -8) = 0x24402f;
      throw_std_bad_alloc();
    }
    *(undefined8 *)(puVar8 + -8) = 0x24403e;
    pRVar7 = level3_blocking<float,_float>::blockB(blocking);
    if (pRVar7 == (RhsScalar *)0x0) {
      if (size_00 * 4 < 0x20001) {
        puVar8 = puVar8 + -(size_00 * 4 + 0x1e & 0xfffffffffffffff0);
        local_398 = (RhsScalar *)((ulong)(puVar8 + 0xf) & 0xfffffffffffffff0);
      }
      else {
        *(undefined8 *)(puVar8 + -8) = 0x2440aa;
        local_3a0 = (RhsScalar *)aligned_malloc(size_00 * 4);
        local_398 = local_3a0;
      }
      local_390 = local_398;
    }
    else {
      *(undefined8 *)(puVar8 + -8) = 0x24404d;
      local_390 = level3_blocking<float,_float>::blockB(blocking);
    }
    blockB_stack_memory_destructor._16_8_ = local_390;
    *(undefined8 *)(puVar8 + -8) = 0x2440e8;
    pRVar7 = level3_blocking<float,_float>::blockB(blocking);
    if (pRVar7 == (RhsScalar *)0x0) {
      local_3a8 = (float *)blockB_stack_memory_destructor._16_8_;
    }
    else {
      local_3a8 = (float *)0x0;
    }
    pfVar3 = local_3a8;
    *(undefined8 *)(puVar8 + -8) = 0x244136;
    aligned_stack_memory_handler<float>::aligned_stack_memory_handler
              ((aligned_stack_memory_handler<float> *)local_2f0,pfVar3,size_00,0x20000 < size_00 * 4
              );
    local_3a9 = false;
    if ((local_270 != cols_local) && (local_3a9 = false, (float *)mc == _lhs_local)) {
      local_3a9 = lVar1 == depth_local;
    }
    i2._7_1_ = local_3a9;
    for (actual_mc = 0; actual_mc < cols_local; actual_mc = local_270 + actual_mc) {
      k2 = actual_mc + local_270;
      *(undefined8 *)(puVar8 + -8) = 0x2441d4;
      plVar5 = std::min<long>(&k2,&cols_local);
      local_308 = *plVar5 - actual_mc;
      for (actual_kc = 0; actual_kc < (long)_lhs_local; actual_kc = mc + actual_kc) {
        local_328 = actual_kc + mc;
        *(undefined8 *)(puVar8 + -8) = 0x24422c;
        plVar5 = std::min<long>(&local_328,(long *)&_lhs_local);
        uVar4 = blockA_stack_memory_destructor._16_8_;
        lVar2 = local_308;
        lVar9 = *plVar5 - actual_kc;
        local_320 = lVar9;
        local_3b8 = blockA_stack_memory_destructor.m_deallocate;
        uStack_3b7 = blockA_stack_memory_destructor._17_7_;
        local_88 = &rhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride;
        local_90 = actual_mc;
        local_98 = actual_kc;
        local_48 = local_88;
        local_50 = actual_mc;
        local_58 = actual_kc;
        local_68 = rhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride +
                   (actual_kc + actual_mc * lhsStride) * 4;
        local_60 = local_80;
        local_70 = lhsStride;
        local_28 = local_80;
        local_30 = local_68;
        local_38 = lhsStride;
        local_40 = 1;
        local_3c8 = local_68;
        local_3c0 = lhsStride;
        j2 = local_68;
        local_330 = lhsStride;
        *(undefined8 *)(puVar8 + -0x10) = 0;
        *(undefined8 *)(puVar8 + -0x18) = 0x244388;
        gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_1,_false,_false>
        ::operator()((gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_1,_false,_false>
                      *)((long)&sizeA + 7),(float *)uVar4,
                     (const_blas_data_mapper<float,_long,_1> *)&j2,lVar9,lVar2,0,
                     *(long *)(puVar8 + -0x10));
        for (actual_nc = 0; actual_nc < depth_local; actual_nc = lVar1 + actual_nc) {
          local_350 = actual_nc + lVar1;
          *(undefined8 *)(puVar8 + -8) = 0x2443d5;
          plVar5 = std::min<long>(&local_350,&depth_local);
          uVar4 = blockB_stack_memory_destructor._16_8_;
          lVar2 = local_320;
          lVar9 = *plVar5 - actual_nc;
          local_348 = lVar9;
          if (((i2._7_1_ & 1) == 0) || (actual_mc == 0)) {
            local_3d0 = blockB_stack_memory_destructor.m_deallocate;
            uStack_3cf = blockB_stack_memory_destructor._17_7_;
            local_148 = &res.m_stride;
            local_150 = actual_kc;
            local_158 = actual_nc;
            local_108 = &res.m_stride;
            local_110 = actual_kc;
            local_118 = actual_nc;
            local_128 = (float *)(res.m_stride +
                                 (actual_kc +
                                 actual_nc *
                                 (long)rhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data
                                 ) * 4);
            local_120 = local_140;
            local_130 = rhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
            local_e8 = local_140;
            local_f0 = local_128;
            local_f8 = rhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
            local_100 = 1;
            local_3e0 = local_128;
            local_3d8 = rhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
            local_360.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data = local_128;
            local_360.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride =
                 (long)rhs.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
            *(undefined8 *)(puVar8 + -0x10) = 0;
            *(undefined8 *)(puVar8 + -0x18) = 0x244593;
            gemm_pack_rhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_4,_0,_false,_false>
            ::operator()((gemm_pack_rhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_4,_0,_false,_false>
                          *)((long)&sizeA + 6),(float *)uVar4,&local_360,lVar2,lVar9,0,
                         *(long *)(puVar8 + -0x10));
          }
          blockA_00 = blockA_stack_memory_destructor._16_8_;
          uVar4 = blockB_stack_memory_destructor._16_8_;
          lVar9 = local_308;
          lVar2 = local_320;
          local_d0 = &kc;
          local_d8 = actual_mc;
          local_e0 = actual_nc;
          local_10 = &kc;
          local_18 = actual_mc;
          local_20 = actual_nc;
          local_a8 = (float *)(kc + (actual_mc + actual_nc * (long)res.m_data) * 4);
          local_a0 = local_c8;
          local_b0 = res.m_data;
          local_b8 = 1;
          local_3f0 = local_a8;
          local_3e8 = res.m_data;
          local_370.m_data = local_a8;
          local_370.m_stride = (long)res.m_data;
          *(long *)(puVar8 + -0x30) = local_348;
          *(undefined8 *)(puVar8 + -0x10) = 0;
          *(undefined8 *)(puVar8 + -0x18) = 0;
          *(undefined8 *)(puVar8 + -0x20) = 0xffffffffffffffff;
          *(undefined8 *)(puVar8 + -0x28) = 0xffffffffffffffff;
          *(undefined8 *)(puVar8 + -0x38) = 0x24474e;
          gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
          ::operator()((gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
                        *)((long)&sizeA + 5),&local_370,(float *)blockA_00,(float *)uVar4,lVar9,
                       lVar2,*(long *)(puVar8 + -0x30),alpha,*(long *)(puVar8 + -0x28),
                       *(long *)(puVar8 + -0x20),*(long *)(puVar8 + -0x18),*(long *)(puVar8 + -0x10)
                      );
        }
      }
    }
    *(undefined8 *)(puVar8 + -8) = 0x2447b4;
    aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<float> *)local_2f0);
    *(undefined8 *)(puVar8 + -8) = 0x2447c0;
    aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<float> *)local_2c0);
    return;
  }
  __assert_fail("incr==1",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/BlasUtil.h"
                ,0xae,
                "Eigen::internal::blas_data_mapper<float, long, 0>::blas_data_mapper(Scalar *, Index, Index) [Scalar = float, Index = long, StorageOrder = 0, AlignmentType = 0, Incr = 1]"
               );
}

Assistant:

static void run(Index rows, Index cols, Index depth,
  const LhsScalar* _lhs, Index lhsStride,
  const RhsScalar* _rhs, Index rhsStride,
  ResScalar* _res, Index resIncr, Index resStride,
  ResScalar alpha,
  level3_blocking<LhsScalar,RhsScalar>& blocking,
  GemmParallelInfo<Index>* info = 0)
{
  typedef const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> LhsMapper;
  typedef const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> RhsMapper;
  typedef blas_data_mapper<typename Traits::ResScalar, Index, ColMajor,Unaligned,ResInnerStride> ResMapper;
  LhsMapper lhs(_lhs, lhsStride);
  RhsMapper rhs(_rhs, rhsStride);
  ResMapper res(_res, resStride, resIncr);

  Index kc = blocking.kc();                   // cache block size along the K direction
  Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction
  Index nc = (std::min)(cols,blocking.nc());  // cache block size along the N direction

  gemm_pack_lhs<LhsScalar, Index, LhsMapper, Traits::mr, Traits::LhsProgress, typename Traits::LhsPacket4Packing, LhsStorageOrder> pack_lhs;
  gemm_pack_rhs<RhsScalar, Index, RhsMapper, Traits::nr, RhsStorageOrder> pack_rhs;
  gebp_kernel<LhsScalar, RhsScalar, Index, ResMapper, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;

#ifdef EIGEN_HAS_OPENMP
  if(info)
  {
    // this is the parallel version!
    int tid = omp_get_thread_num();
    int threads = omp_get_num_threads();

    LhsScalar* blockA = blocking.blockA();
    eigen_internal_assert(blockA!=0);

    std::size_t sizeB = kc*nc;
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, 0);

    // For each horizontal panel of the rhs, and corresponding vertical panel of the lhs...
    for(Index k=0; k<depth; k+=kc)
    {
      const Index actual_kc = (std::min)(k+kc,depth)-k; // => rows of B', and cols of the A'

      // In order to reduce the chance that a thread has to wait for the other,
      // let's start by packing B'.
      pack_rhs(blockB, rhs.getSubMapper(k,0), actual_kc, nc);

      // Pack A_k to A' in a parallel fashion:
      // each thread packs the sub block A_k,i to A'_i where i is the thread id.

      // However, before copying to A'_i, we have to make sure that no other thread is still using it,
      // i.e., we test that info[tid].users equals 0.
      // Then, we set info[tid].users to the number of threads to mark that all other threads are going to use it.
      while(info[tid].users!=0) {}
      info[tid].users = threads;

      pack_lhs(blockA+info[tid].lhs_start*actual_kc, lhs.getSubMapper(info[tid].lhs_start,k), actual_kc, info[tid].lhs_length);

      // Notify the other threads that the part A'_i is ready to go.
      info[tid].sync = k;

      // Computes C_i += A' * B' per A'_i
      for(int shift=0; shift<threads; ++shift)
      {
        int i = (tid+shift)%threads;

        // At this point we have to make sure that A'_i has been updated by the thread i,
        // we use testAndSetOrdered to mimic a volatile access.
        // However, no need to wait for the B' part which has been updated by the current thread!
        if (shift>0) {
          while(info[i].sync!=k) {
          }
        }

        gebp(res.getSubMapper(info[i].lhs_start, 0), blockA+info[i].lhs_start*actual_kc, blockB, info[i].lhs_length, actual_kc, nc, alpha);
      }

      // Then keep going as usual with the remaining B'
      for(Index j=nc; j<cols; j+=nc)
      {
        const Index actual_nc = (std::min)(j+nc,cols)-j;

        // pack B_k,j to B'
        pack_rhs(blockB, rhs.getSubMapper(k,j), actual_kc, actual_nc);

        // C_j += A' * B'
        gebp(res.getSubMapper(0, j), blockA, blockB, rows, actual_kc, actual_nc, alpha);
      }

      // Release all the sub blocks A'_i of A' for the current thread,
      // i.e., we simply decrement the number of users by 1
      for(Index i=0; i<threads; ++i)
#if !EIGEN_HAS_CXX11_ATOMIC
        #pragma omp atomic
#endif
        info[i].users -= 1;
    }
  }
  else
#endif // EIGEN_HAS_OPENMP
  {
    EIGEN_UNUSED_VARIABLE(info);

    // this is the sequential version!
    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*nc;

    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, blocking.blockB());

    const bool pack_rhs_once = mc!=rows && kc==depth && nc==cols;

    // For each horizontal panel of the rhs, and corresponding panel of the lhs...
    for(Index i2=0; i2<rows; i2+=mc)
    {
      const Index actual_mc = (std::min)(i2+mc,rows)-i2;

      for(Index k2=0; k2<depth; k2+=kc)
      {
        const Index actual_kc = (std::min)(k2+kc,depth)-k2;

        // OK, here we have selected one horizontal panel of rhs and one vertical panel of lhs.
        // => Pack lhs's panel into a sequential chunk of memory (L2/L3 caching)
        // Note that this panel will be read as many times as the number of blocks in the rhs's
        // horizontal panel which is, in practice, a very low number.
        pack_lhs(blockA, lhs.getSubMapper(i2,k2), actual_kc, actual_mc);

        // For each kc x nc block of the rhs's horizontal panel...
        for(Index j2=0; j2<cols; j2+=nc)
        {
          const Index actual_nc = (std::min)(j2+nc,cols)-j2;

          // We pack the rhs's block into a sequential chunk of memory (L2 caching)
          // Note that this block will be read a very high number of times, which is equal to the number of
          // micro horizontal panel of the large rhs's panel (e.g., rows/12 times).
          if((!pack_rhs_once) || i2==0)
            pack_rhs(blockB, rhs.getSubMapper(k2,j2), actual_kc, actual_nc);

          // Everything is packed, we can now call the panel * block kernel:
          gebp(res.getSubMapper(i2, j2), blockA, blockB, actual_mc, actual_kc, actual_nc, alpha);
        }
      }
    }
  }
}